

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OoutFormat.cpp
# Opt level: O1

string * __thiscall
oout::OoutFormat::error(string *__return_storage_ptr__,OoutFormat *this,string *text)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + text->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string OoutFormat::error(const string &text) const
{
	return text;
}